

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

void __thiscall FDecalLib::ParseFader(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FDecalAnimator *pFVar3;
  int iVar4;
  FString faderName;
  int local_3c;
  FString local_38;
  
  local_38.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  FString::operator=(&local_38,sc->String);
  FScanner::MustGetStringName(sc,"{");
  local_3c = 0;
  iVar4 = 0;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare(sc,"DecayStart");
    if (bVar1) {
      FScanner::MustGetFloat(sc);
      iVar4 = (int)(sc->Float * 35.0);
    }
    else {
      bVar1 = FScanner::Compare(sc,"DecayTime");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_3c = (int)(sc->Float * 35.0);
      }
      else {
        FScanner::ScriptError(sc,"Unknown fader parameter \'%s\'",sc->String);
      }
    }
  }
  pFVar3 = (FDecalAnimator *)operator_new(0x18);
  pFVar3->_vptr_FDecalAnimator = (_func_int **)&PTR__FDecalAnimator_006f68c0;
  (pFVar3->Name).Index = 0;
  iVar2 = FName::NameManager::FindName(&FName::NameData,local_38.Chars,false);
  (pFVar3->Name).Index = iVar2;
  pFVar3->_vptr_FDecalAnimator = (_func_int **)&PTR__FDecalAnimator_006f6a00;
  *(int *)&pFVar3->field_0xc = iVar4;
  *(int *)&pFVar3[1]._vptr_FDecalAnimator = local_3c;
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Grow
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,1);
  Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array
  [Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count] = pFVar3;
  Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count =
       Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count + 1;
  FString::~FString(&local_38);
  return;
}

Assistant:

void FDecalLib::ParseFader (FScanner &sc)
{
	FString faderName;
	int startTime = 0, decayTime = 0;

	sc.MustGetString ();
	faderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			FDecalFaderAnim *fader = new FDecalFaderAnim (faderName);
			fader->DecayStart = startTime;
			fader->DecayTime = decayTime;
			Animators.Push (fader);
			break;
		}
		else if (sc.Compare ("DecayStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("DecayTime"))
		{
			sc.MustGetFloat ();
			decayTime = (int)(sc.Float * TICRATE);
		}
		else
		{
			sc.ScriptError ("Unknown fader parameter '%s'", sc.String);
		}
	}
}